

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

BlockEventExpressionSyntax * __thiscall
slang::parsing::Parser::parseBlockEventExpression(Parser *this)

{
  bool bVar1;
  NameSyntax *name;
  BinaryBlockEventExpressionSyntax *left;
  BlockEventExpressionSyntax *right;
  Token TVar2;
  Token local_38;
  
  Token::Token(&local_38);
  TVar2 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar2.kind == EndKeyword) || (TVar2.kind == BeginKeyword)) {
    local_38 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_38 = ParserBase::expect(&this->super_ParserBase,BeginKeyword);
  }
  name = parseName(this);
  left = (BinaryBlockEventExpressionSyntax *)
         slang::syntax::SyntaxFactory::primaryBlockEventExpression(&this->factory,local_38,name);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OrKeyword);
  if (bVar1) {
    TVar2 = ParserBase::consume(&this->super_ParserBase);
    right = parseBlockEventExpression(this);
    left = slang::syntax::SyntaxFactory::binaryBlockEventExpression
                     (&this->factory,(BlockEventExpressionSyntax *)left,TVar2,right);
  }
  return &left->super_BlockEventExpressionSyntax;
}

Assistant:

BlockEventExpressionSyntax& Parser::parseBlockEventExpression() {
    Token keyword;
    switch (peek().kind) {
        case TokenKind::BeginKeyword:
        case TokenKind::EndKeyword:
            keyword = consume();
            break;
        default:
            keyword = expect(TokenKind::BeginKeyword);
            break;
    }

    auto& name = parseName();
    auto& left = factory.primaryBlockEventExpression(keyword, name);

    if (peek(TokenKind::OrKeyword)) {
        auto op = consume();
        auto& right = parseBlockEventExpression();
        return factory.binaryBlockEventExpression(left, op, right);
    }
    return left;
}